

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O0

bool httplib::detail::bind_ip_address(socket_t sock,char *host)

{
  int iVar1;
  addrinfo *ai;
  addrinfo *rp;
  addrinfo *paStack_50;
  bool ret;
  addrinfo *result;
  addrinfo hints;
  char *host_local;
  socket_t sock_local;
  
  hints.ai_next = (addrinfo *)host;
  memset(&result,0,0x30);
  result._4_4_ = 0;
  hints.ai_flags = 1;
  hints.ai_family = 0;
  iVar1 = getaddrinfo((char *)hints.ai_next,"0",(addrinfo *)&result,
                      (addrinfo **)&stack0xffffffffffffffb0);
  if (iVar1 == 0) {
    host_local._7_1_ = false;
    for (ai = paStack_50; ai != (addrinfo *)0x0; ai = ai->ai_next) {
      iVar1 = bind(sock,(sockaddr *)ai->ai_addr,ai->ai_addrlen);
      if (iVar1 == 0) {
        host_local._7_1_ = true;
        break;
      }
    }
    freeaddrinfo((addrinfo *)paStack_50);
  }
  else {
    host_local._7_1_ = false;
  }
  return host_local._7_1_;
}

Assistant:

inline bool bind_ip_address(socket_t sock, const char* host) {
            struct addrinfo hints;
            struct addrinfo* result;

            memset(&hints, 0, sizeof(struct addrinfo));
            hints.ai_family = AF_UNSPEC;
            hints.ai_socktype = SOCK_STREAM;
            hints.ai_protocol = 0;

            if (getaddrinfo(host, "0", &hints, &result)) { return false; }

            auto ret = false;
            for (auto rp = result; rp; rp = rp->ai_next) {
                const auto& ai = *rp;
                if (!::bind(sock, ai.ai_addr, static_cast<socklen_t>(ai.ai_addrlen))) {
                    ret = true;
                    break;
                }
            }

            freeaddrinfo(result);
            return ret;
        }